

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_print_mode(kvtree *hash,int indent,int mode)

{
  uint indent_00;
  kvtree_struct *pkVar1;
  size_t __n;
  kvtree_elem_struct *pkVar2;
  int iVar3;
  kvtree_struct *pkVar4;
  kvtree_elem_struct *pkVar5;
  char tmp [1024];
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  if (0 < indent) {
    memset(local_838,0x20,(ulong)(uint)indent);
  }
  local_838[indent] = 0;
  if (hash == (kvtree *)0x0) {
    printf("%sNULL LIST\n",local_838);
  }
  else {
    pkVar5 = hash->lh_first;
    if (pkVar5 != (kvtree_elem_struct *)0x0) {
      indent_00 = indent + 2;
      __n = 1;
      if (1 < (int)indent_00) {
        __n = (size_t)indent_00;
      }
      do {
        if (-2 < indent) {
          memset(local_438,0x20,__n);
        }
        local_438[(int)indent_00] = 0;
        if (mode == 2) {
          if (pkVar5->key == (char *)0x0) {
            printf("%sNULL KEY\n",local_438);
          }
          else {
            pkVar4 = pkVar5->hash;
            if ((pkVar4 != (kvtree_struct *)0x0) &&
               (pkVar2 = pkVar4->lh_first, pkVar2 != (kvtree_elem_struct *)0x0)) {
              iVar3 = 1;
              do {
                pkVar2 = (pkVar2->pointers).le_next;
                iVar3 = iVar3 + -1;
              } while (pkVar2 != (kvtree_elem_struct *)0x0);
              if (iVar3 == 0) {
                pkVar1 = pkVar4->lh_first->hash;
                if ((pkVar1 == (kvtree_struct *)0x0) ||
                   (pkVar1->lh_first == (kvtree_elem_struct *)0x0)) {
                  printf("%s%s = %s\n",local_438,pkVar5->key,pkVar4->lh_first->key);
                  goto LAB_00105d6a;
                }
              }
            }
            printf("%s%s\n",local_438);
          }
          pkVar4 = pkVar5->hash;
          iVar3 = 2;
LAB_00105d65:
          kvtree_print_mode(pkVar4,indent_00,iVar3);
        }
        else if (mode == 1) {
          if (pkVar5->key == (char *)0x0) {
            printf("%sNULL KEY\n",local_438);
          }
          else {
            printf("%s%s\n",local_438);
          }
          pkVar4 = pkVar5->hash;
          iVar3 = 1;
          goto LAB_00105d65;
        }
LAB_00105d6a:
        pkVar5 = (pkVar5->pointers).le_next;
      } while (pkVar5 != (kvtree_elem_struct *)0x0);
    }
  }
  return 0;
}

Assistant:

int kvtree_print_mode(const kvtree* hash, int indent, int mode)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_print(elem, indent + 2, mode);
    }
  } else {
    printf("%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}